

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int GmfCpyLin(int64_t InpIdx,int64_t OutIdx,int KwdCod)

{
  int iVar1;
  GmfMshSct *msh;
  size_t sVar2;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  KwdSct *kwd;
  GmfMshSct *OutMsh;
  GmfMshSct *InpMsh;
  int64_t l;
  int err;
  int a;
  int i;
  float f;
  double d;
  char s [256];
  void *in_stack_fffffffffffffe98;
  long local_148;
  undefined4 local_140;
  uint local_13c;
  int local_138;
  float local_134;
  double local_130;
  undefined1 local_128 [268];
  int local_1c;
  int local_4;
  
  msh = (GmfMshSct *)(in_RDI + 0x110 + (long)in_EDX * 0x3300);
  local_1c = in_EDX;
  iVar1 = _setjmp((__jmp_buf_tag *)(in_RDI + 0x48));
  if (iVar1 == 0) {
    local_140 = 0;
    for (local_138 = 0; local_138 < msh->typ; local_138 = local_138 + 1) {
      if (*(char *)((long)msh->KwdTab[0].TypTab + (long)local_138 + 0xeb0) == 'r') {
        if (*(int *)(in_RDI + 0x18) == 0x20) {
          if ((*(uint *)(in_RDI + 0xc) & 1) == 0) {
            ScaWrd(msh,in_stack_fffffffffffffe98);
          }
          else {
            iVar1 = __isoc99_fscanf(*(undefined8 *)(in_RDI + 0x300410),"%f",&local_134);
            if (iVar1 != 1) {
              longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-1);
            }
          }
          local_130 = (double)local_134;
        }
        else {
          if ((*(uint *)(in_RDI + 0xc) & 1) == 0) {
            ScaDblWrd(msh,in_stack_fffffffffffffe98);
          }
          else {
            iVar1 = __isoc99_fscanf(*(undefined8 *)(in_RDI + 0x300410),"%lf",&local_130);
            if (iVar1 != 1) {
              longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-1);
            }
          }
          local_134 = (float)local_130;
        }
        if (*(int *)(in_RSI + 0x18) == 0x20) {
          if ((*(uint *)(in_RSI + 0xc) & 1) == 0) {
            RecWrd(msh,in_stack_fffffffffffffe98);
          }
          else {
            fprintf(*(FILE **)(in_RSI + 0x300410),"%.9g ",(double)local_134);
          }
        }
        else if ((*(uint *)(in_RSI + 0xc) & 1) == 0) {
          RecDblWrd(msh,in_stack_fffffffffffffe98);
        }
        else {
          fprintf(*(FILE **)(in_RSI + 0x300410),"%.17g ",local_130);
        }
      }
      else if (*(char *)((long)msh->KwdTab[0].TypTab + (long)local_138 + 0xeb0) == 'i') {
        if (*(int *)(in_RDI + 4) < 4) {
          if ((*(uint *)(in_RDI + 0xc) & 1) == 0) {
            ScaWrd(msh,in_stack_fffffffffffffe98);
          }
          else {
            iVar1 = __isoc99_fscanf(*(undefined8 *)(in_RDI + 0x300410),"%d",&local_13c);
            if (iVar1 != 1) {
              longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-1);
            }
          }
          local_148 = (long)(int)local_13c;
        }
        else {
          if ((*(uint *)(in_RDI + 0xc) & 1) == 0) {
            ScaDblWrd(msh,in_stack_fffffffffffffe98);
          }
          else {
            iVar1 = __isoc99_fscanf(*(undefined8 *)(in_RDI + 0x300410),"%ld",&local_148);
            if (iVar1 != 1) {
              longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-1);
            }
          }
          local_13c = (uint)local_148;
        }
        if ((local_138 == msh->typ + -1) && (GmfMaxRefTab[local_1c] < (int)local_13c)) {
          GmfMaxRefTab[local_1c] = local_13c;
        }
        if (*(int *)(in_RSI + 4) < 4) {
          if ((*(uint *)(in_RSI + 0xc) & 1) == 0) {
            RecWrd(msh,in_stack_fffffffffffffe98);
          }
          else {
            fprintf(*(FILE **)(in_RSI + 0x300410),"%d ",(ulong)local_13c);
          }
        }
        else if ((*(uint *)(in_RSI + 0xc) & 1) == 0) {
          RecDblWrd(msh,in_stack_fffffffffffffe98);
        }
        else {
          fprintf(*(FILE **)(in_RSI + 0x300410),"%ld ",local_148);
        }
      }
      else if (*(char *)((long)msh->KwdTab[0].TypTab + (long)local_138 + 0xeb0) == 'c') {
        memset(local_128,0,0x100);
        if ((*(uint *)(in_RDI + 0xc) & 1) == 0) {
          sVar2 = fread(local_128,4,0x40,*(FILE **)(in_RDI + 0x300410));
          if (sVar2 != 0x40) {
            longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-3);
          }
        }
        else {
          iVar1 = __isoc99_fscanf(*(undefined8 *)(in_RDI + 0x300410),"%s",local_128);
          if (iVar1 != 1) {
            longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-1);
          }
        }
        if ((*(uint *)(in_RSI + 0xc) & 1) == 0) {
          fwrite(local_128,4,0x40,*(FILE **)(in_RSI + 0x300410));
        }
        else {
          fprintf(*(FILE **)(in_RSI + 0x300410),"%s ",local_128);
        }
      }
    }
    if ((*(uint *)(in_RSI + 0xc) & 1) != 0) {
      fprintf(*(FILE **)(in_RSI + 0x300410),"\n");
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int GmfCpyLin(int64_t InpIdx, int64_t OutIdx, int KwdCod)
{
   char        s[ WrdSiz * FilStrSiz ];
   double      d;
   float       f;
   int         i, a, err;
   int64_t     l;
   GmfMshSct   *InpMsh = (GmfMshSct *)InpIdx, *OutMsh = (GmfMshSct *)OutIdx;
   KwdSct      *kwd = &InpMsh->KwdTab[ KwdCod ];

   // Save the current stack environment for longjmp
   if( (err = setjmp(InpMsh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", InpMsh, err);
#endif
      return(0);
   }

   for(i=0;i<kwd->SolSiz;i++)
   {
      if(kwd->fmt[i] == 'r')
      {
         if(InpMsh->FltSiz == 32)
         {
            if(InpMsh->typ & Asc)
               safe_fscanf(InpMsh->hdl, "%f", &f, InpMsh->err);
            else
               ScaWrd(InpMsh, (unsigned char *)&f);

            d = (double)f;
         }
         else
         {
            if(InpMsh->typ & Asc)
               safe_fscanf(InpMsh->hdl, "%lf", &d, InpMsh->err);
            else
               ScaDblWrd(InpMsh, (unsigned char *)&d);

            f = (float)d;
         }

         if(OutMsh->FltSiz == 32)
            if(OutMsh->typ & Asc)
               fprintf(OutMsh->hdl, "%.9g ", (double)f);
            else
               RecWrd(OutMsh, (unsigned char *)&f);
         else
            if(OutMsh->typ & Asc)
               fprintf(OutMsh->hdl, "%.17g ", d);
            else
               RecDblWrd(OutMsh, (unsigned char *)&d);
      }
      else if(kwd->fmt[i] == 'i')
      {
         if(InpMsh->ver <= 3)
         {
            if(InpMsh->typ & Asc)
               safe_fscanf(InpMsh->hdl, "%d", &a, InpMsh->err);
            else
               ScaWrd(InpMsh, (unsigned char *)&a);

            l = (int64_t)a;
         }
         else
         {
            if(InpMsh->typ & Asc)
               safe_fscanf(InpMsh->hdl, INT64_T_FMT, &l, InpMsh->err);
            else
               ScaDblWrd(InpMsh, (unsigned char *)&l);

            a = (int)l;
         }

         if( (i == kwd->SolSiz-1) && (a > GmfMaxRefTab[ KwdCod ]) )
            GmfMaxRefTab[ KwdCod ] = a;

         if(OutMsh->ver <= 3)
         {
            if(OutMsh->typ & Asc)
               fprintf(OutMsh->hdl, "%d ", a);
            else
               RecWrd(OutMsh, (unsigned char *)&a);
         }
         else
         {
            if(OutMsh->typ & Asc)
               fprintf(OutMsh->hdl, INT64_T_FMT" ", l);
            else
               RecDblWrd(OutMsh, (unsigned char *)&l);
         }
      }
      else if(kwd->fmt[i] == 'c')
      {
         memset(s, 0, FilStrSiz * WrdSiz);

         if(InpMsh->typ & Asc)
         {
            //safe_fgets(s, WrdSiz * FilStrSiz, InpMsh->hdl, InpMsh->err);
            safe_fscanf(InpMsh->hdl, "%s", s, InpMsh->err);
         }
         else
#ifdef WITH_GMF_AIO
            read(InpMsh->FilDes, s, WrdSiz * FilStrSiz);
#else
            safe_fread(s, WrdSiz, FilStrSiz, InpMsh->hdl, InpMsh->err);
#endif
         if(OutMsh->typ & Asc)
            fprintf(OutMsh->hdl, "%s ", s);
         else
#ifdef WITH_GMF_AIO
            write(OutMsh->FilDes, s, WrdSiz * FilStrSiz);
#else
            fwrite(s, WrdSiz, FilStrSiz, OutMsh->hdl);
#endif
      }
   }

   if(OutMsh->typ & Asc)
      fprintf(OutMsh->hdl, "\n");

   return(1);
}